

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O0

uint32_t icu_63::CollationFastLatin::lookup(uint16_t *table,UChar32 c)

{
  UChar32 c_local;
  uint16_t *table_local;
  
  if ((c < 0x2000) || (0x203f < c)) {
    if (c == 0xfffe) {
      table_local._4_4_ = 3;
    }
    else if (c == 0xffff) {
      table_local._4_4_ = 0xfca8;
    }
    else {
      table_local._4_4_ = 1;
    }
  }
  else {
    table_local._4_4_ = (uint)table[c + -0x1e80];
  }
  return table_local._4_4_;
}

Assistant:

uint32_t
CollationFastLatin::lookup(const uint16_t *table, UChar32 c) {
    U_ASSERT(c > LATIN_MAX);
    if(PUNCT_START <= c && c < PUNCT_LIMIT) {
        return table[c - PUNCT_START + LATIN_LIMIT];
    } else if(c == 0xfffe) {
        return MERGE_WEIGHT;
    } else if(c == 0xffff) {
        return MAX_SHORT | COMMON_SEC | LOWER_CASE | COMMON_TER;
    } else {
        return BAIL_OUT;
    }
}